

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::anon_unknown_0::AddDescriptorsImpl(DescriptorTable *table)

{
  SCCInfoBase *in_RDI;
  int i_1;
  int i;
  int in_stack_0000004c;
  void *in_stack_00000050;
  int local_10;
  int local_c;
  
  for (local_c = 0; local_c < in_RDI[2].num_implicit_weak_deps; local_c = local_c + 1) {
    internal::InitSCC(in_RDI);
  }
  for (local_10 = 0; local_10 < *(int *)&in_RDI[2].field_0xc; local_10 = local_10 + 1) {
    if (*(long *)(*(long *)(in_RDI + 2) + (long)local_10 * 8) != 0) {
      internal::AddDescriptors((DescriptorTable *)0x6d9475);
    }
  }
  DescriptorPool::InternalAddGeneratedFile(in_stack_00000050,in_stack_0000004c);
  MessageFactory::InternalRegisterGeneratedFile((DescriptorTable *)0x6d94a4);
  return;
}

Assistant:

void AddDescriptorsImpl(const DescriptorTable* table) {
  // Reflection refers to the default instances so make sure they are
  // initialized.
  for (int i = 0; i < table->num_sccs; i++) {
    internal::InitSCC(table->init_default_instances[i]);
  }

  // Ensure all dependent descriptors are registered to the generated descriptor
  // pool and message factory.
  for (int i = 0; i < table->num_deps; i++) {
    // In case of weak fields deps[i] could be null.
    if (table->deps[i]) AddDescriptors(table->deps[i]);
  }

  // Register the descriptor of this file.
  DescriptorPool::InternalAddGeneratedFile(table->descriptor, table->size);
  MessageFactory::InternalRegisterGeneratedFile(table);
}